

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat_tests.cpp
# Opt level: O0

void __thiscall iu_Repeat_x_iutest_x_Counter_Test::Body(iu_Repeat_x_iutest_x_Counter_Test *this)

{
  bool bVar1;
  UnitTest *this_00;
  char *message;
  AssertionHelper local_208;
  Fixed local_1d8;
  int local_3c;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_Repeat_x_iutest_x_Counter_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  this_00 = iutest::UnitTest::GetInstance();
  local_3c = iutest::UnitTest::repeat_counter(this_00);
  local_3c = local_3c + 1;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_38,"g_environment_setup",
             "::iutest::UnitTest::GetInstance()->repeat_counter()+1",&g_environment_setup,&local_3c)
  ;
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    message = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/repeat_tests.cpp"
               ,0x3e,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

IUTEST(Repeat, Counter)
{
#if !defined(IUTEST_USE_GTEST)
    IUTEST_ASSERT_EQ(g_environment_setup, ::iutest::UnitTest::GetInstance()->repeat_counter()+1);
#endif
}